

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O1

void __thiscall Ptex::v2_4::PtexReaderCache::pruneData(PtexReaderCache *this)

{
  size_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  PtexCachedReader *this_00;
  long lVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  sVar2 = this->_memUsed;
  lVar6 = 0;
  do {
    if (lVar6 + sVar2 <= this->_maxMem) break;
    this_00 = PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_activeFilesItem>
              ::pop(&this->_activeFiles);
    if (this_00 != (PtexCachedReader *)0x0) {
      LOCK();
      bVar7 = this_00->_refCount == 0;
      if (bVar7) {
        this_00->_refCount = -1;
      }
      UNLOCK();
      if (bVar7) {
        PtexReader::prune(&this_00->super_PtexReader);
        sVar3 = (this_00->super_PtexReader)._memUsed;
        lVar4 = sVar3 - this_00->_memUsedAccountedFor;
        this_00->_memUsedAccountedFor = sVar3;
        this_00->_refCount = 0;
      }
      else {
        lVar4 = 0;
      }
      lVar6 = lVar6 + lVar4;
    }
  } while (this_00 != (PtexCachedReader *)0x0);
  if (lVar6 != 0) {
    LOCK();
    psVar1 = &this->_memUsed;
    sVar2 = *psVar1;
    *psVar1 = *psVar1 + lVar6;
    UNLOCK();
    uVar5 = sVar2 + lVar6;
    if (sVar2 + lVar6 < this->_peakMemUsed) {
      uVar5 = this->_peakMemUsed;
    }
    this->_peakMemUsed = uVar5;
  }
  return;
}

Assistant:

void PtexReaderCache::pruneData()
{
    size_t memUsedChangeTotal = 0;
    size_t memUsed = _memUsed;
    while (memUsed + memUsedChangeTotal > _maxMem) {
        PtexCachedReader* reader = _activeFiles.pop();
        if (!reader) break;
        size_t memUsedChange;
        if (reader->tryPrune(memUsedChange)) {
            // Note: after clearing, memUsedChange is negative
            memUsedChangeTotal += memUsedChange;
        }
    }
    adjustMemUsed(memUsedChangeTotal);
}